

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Performance::anon_unknown_1::MapBufferRangeCase::init
          (MapBufferRangeCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  long lVar2;
  char *pcVar3;
  EVP_PKEY_CTX *ctx_00;
  bool bVar4;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_198._0_8_ =
       ((this->
        super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
        ).
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
        .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Testing glMapBufferRange() and glUnmapBuffer() function call performance.\n",0x4a);
  pcVar3 = "Half of the buffer is mapped.";
  if (this->m_fullUpload != false) {
    pcVar3 = "The whole buffer is mapped.";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,pcVar3,(ulong)(this->m_fullUpload ^ 1) * 2 + 0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  pcVar3 = 
  "The buffer has not been used before mapping and is allocated with unspecified contents.\n";
  bVar4 = this->m_useUnusedUnspecifiedBuffer == false;
  if (bVar4) {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
  }
  lVar2 = 0x58;
  if (bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  pcVar3 = "The buffer has not been used before mapping and is allocated with specified contents.\n"
  ;
  bVar4 = this->m_useUnusedSpecifiedBuffer == false;
  if (bVar4) {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
  }
  lVar2 = 0x56;
  if (bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  pcVar3 = "The buffer has previously been used in a drawing operation.\n";
  bVar4 = ((this->m_useUnusedUnspecifiedBuffer | this->m_useUnusedSpecifiedBuffer) & 1U) != 0;
  if (bVar4) {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
  }
  lVar2 = 0x3c;
  if (bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  pcVar3 = "The buffer is cleared with glBufferData(..., NULL) before mapping.\n";
  bVar4 = this->m_manualInvalidation == false;
  if (bVar4) {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
  }
  lVar2 = 0x43;
  if (bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Map bits:\n",10);
  bVar4 = (this->m_mapFlags & 2) == 0;
  pcVar3 = "\tGL_MAP_WRITE_BIT\n";
  if (bVar4) {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
  }
  lVar2 = 0x12;
  if (bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  bVar4 = (this->m_mapFlags & 1) == 0;
  pcVar3 = "\tGL_MAP_READ_BIT\n";
  if (bVar4) {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
  }
  lVar2 = 0x11;
  if (bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  bVar4 = (this->m_mapFlags & 4) == 0;
  pcVar3 = "\tGL_MAP_INVALIDATE_RANGE_BIT\n";
  if (bVar4) {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
  }
  lVar2 = 0x1d;
  if (bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  bVar4 = (this->m_mapFlags & 8) == 0;
  pcVar3 = "\tGL_MAP_INVALIDATE_BUFFER_BIT\n";
  if (bVar4) {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
  }
  lVar2 = 0x1e;
  if (bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  bVar4 = (this->m_mapFlags & 0x20) == 0;
  pcVar3 = "\tGL_MAP_UNSYNCHRONIZED_BIT\n";
  if (bVar4) {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
  }
  lVar2 = 0x1b;
  if (bVar4) {
    lVar2 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar3,lVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_120);
  iVar1 = BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>::
          init(&this->
                super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
               ,ctx_00);
  return iVar1;
}

Assistant:

void MapBufferRangeCase::init (void)
{
	// Describe what the test tries to do
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing glMapBufferRange() and glUnmapBuffer() function call performance.\n"
		<< ((m_fullUpload) ? ("The whole buffer is mapped.") : ("Half of the buffer is mapped.")) << "\n"
		<< ((m_useUnusedUnspecifiedBuffer) ? ("The buffer has not been used before mapping and is allocated with unspecified contents.\n") : (""))
		<< ((m_useUnusedSpecifiedBuffer) ? ("The buffer has not been used before mapping and is allocated with specified contents.\n") : (""))
		<< ((!m_useUnusedSpecifiedBuffer && !m_useUnusedUnspecifiedBuffer) ? ("The buffer has previously been used in a drawing operation.\n") : (""))
		<< ((m_manualInvalidation) ? ("The buffer is cleared with glBufferData(..., NULL) before mapping.\n") : (""))
		<< "Map bits:\n"
		<< ((m_mapFlags & GL_MAP_WRITE_BIT) ? ("\tGL_MAP_WRITE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_READ_BIT) ? ("\tGL_MAP_READ_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_RANGE_BIT) ? ("\tGL_MAP_INVALIDATE_RANGE_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_INVALIDATE_BUFFER_BIT) ? ("\tGL_MAP_INVALIDATE_BUFFER_BIT\n") : (""))
		<< ((m_mapFlags & GL_MAP_UNSYNCHRONIZED_BIT) ? ("\tGL_MAP_UNSYNCHRONIZED_BIT\n") : (""))
		<< tcu::TestLog::EndMessage;

	BasicUploadCase<MapBufferRangeDuration>::init();
}